

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O3

int fl_draw_symbol(char *label,int x,int y,int w,int h,Fl_Color col)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  char *name;
  ulong uVar8;
  uint h_00;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  uint w_00;
  uint uVar13;
  int local_4c;
  double local_48;
  
  if (*label != '@') {
    return 0;
  }
  fl_init_symbols();
  cVar2 = label[1];
  pcVar9 = label + 1;
  if (cVar2 == '#') {
    pcVar9 = label + 2;
  }
  local_4c = y;
  if (label[(ulong)(cVar2 == '#') + 1] == '+') {
    if (8 < (byte)(pcVar9[1] - 0x31U)) goto LAB_001f5c57;
    bVar5 = pcVar9[1] - 0x30;
    uVar12 = -(uint)bVar5;
    iVar11 = (uint)bVar5 * 2;
    iVar6 = (uint)bVar5 * 2;
  }
  else {
    if ((label[(ulong)(cVar2 == '#') + 1] != '-') || (8 < (byte)(pcVar9[1] - 0x31U)))
    goto LAB_001f5c57;
    bVar5 = pcVar9[1] - 0x30;
    uVar12 = (uint)bVar5;
    iVar11 = (uint)bVar5 * -2;
    iVar6 = (uint)bVar5 * -2;
  }
  local_4c = y + uVar12;
  x = x + uVar12;
  h = h + iVar6;
  w = w + iVar11;
  pcVar9 = pcVar9 + 2;
LAB_001f5c57:
  uVar12 = (uint)-(h + -10) >> 1;
  if (9 < h) {
    uVar12 = 0;
  }
  uVar13 = (uint)-(w + -10) >> 1;
  if (9 < w) {
    uVar13 = 0;
  }
  if (w < 0xb) {
    w = 10;
  }
  iVar11 = 10;
  if (10 < h) {
    iVar11 = h;
  }
  cVar3 = *pcVar9;
  uVar7 = (ulong)(cVar3 == '$');
  cVar4 = pcVar9[uVar7];
  uVar8 = (ulong)(cVar4 == '%');
  name = pcVar9 + uVar8 + uVar7;
  if ((byte)pcVar9[uVar8 + uVar7] - 0x30 < 10) {
    pcVar10 = pcVar9 + uVar8 + uVar7 + 1;
    switch((uint)(byte)pcVar9[uVar8 + uVar7]) {
    case 0x30:
      pcVar9 = name + 2;
      pcVar10 = name + 3;
      pcVar1 = name + 4;
      name = name + 5;
      local_48 = (double)(*pcVar10 * 100 + *pcVar9 * 1000 + *pcVar1 * 10 + -0xd020);
      break;
    case 0x31:
      local_48 = 2250.0;
      name = pcVar10;
      break;
    case 0x32:
      local_48 = 2700.0;
      name = pcVar10;
      break;
    case 0x33:
      local_48 = 3150.0;
      name = pcVar10;
      break;
    case 0x34:
      local_48 = 1800.0;
      name = pcVar10;
      break;
    default:
      local_48 = 0.0;
      name = pcVar10;
      break;
    case 0x37:
      local_48 = 1350.0;
      name = pcVar10;
      break;
    case 0x38:
      local_48 = 900.0;
      name = pcVar10;
      break;
    case 0x39:
      local_48 = 450.0;
      name = pcVar10;
    }
  }
  else {
    local_48 = 0.0;
  }
  iVar6 = find(name);
  if (symbols[iVar6].notempty == '\0') {
    iVar11 = 0;
  }
  else {
    w_00 = w - 1U | 1;
    h_00 = iVar11 - 1U | 1;
    if (symbols[iVar6].scalable == '\x03') {
      fl_return_arrow(x - uVar13,local_4c - uVar12,w_00,h_00);
    }
    else {
      Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
      Fl_Graphics_Driver::mult_matrix
                (fl_graphics_driver,1.0,0.0,0.0,1.0,(double)(int)((x - uVar13) + (w - 1U >> 1)),
                 (double)(int)((local_4c - uVar12) + (iVar11 - 1U >> 1)));
      if (symbols[iVar6].scalable != '\0') {
        uVar12 = h_00;
        if (w_00 < h_00) {
          uVar12 = w_00;
        }
        uVar13 = uVar12;
        if (cVar2 != '#') {
          uVar12 = w_00;
          uVar13 = h_00;
        }
        Fl_Graphics_Driver::mult_matrix
                  (fl_graphics_driver,(double)(int)uVar12 * 0.5,0.0,0.0,(double)(int)uVar13 * 0.5,
                   0.0,0.0);
        Fl_Graphics_Driver::rotate(fl_graphics_driver,local_48 / 10.0);
        if (cVar3 == '$') {
          Fl_Graphics_Driver::mult_matrix(fl_graphics_driver,-1.0,0.0,0.0,1.0,0.0,0.0);
        }
        if (cVar4 == '%') {
          Fl_Graphics_Driver::mult_matrix(fl_graphics_driver,1.0,0.0,0.0,-1.0,0.0,0.0);
        }
      }
      (*symbols[iVar6].drawit)(col);
      Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
    }
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

int fl_draw_symbol(const char *label,int x,int y,int w,int h,Fl_Color col) {  
  const char *p = label;
  if (*p++ != '@') return 0;
  fl_init_symbols();
  int equalscale = 0;
  if (*p == '#') {equalscale = 1; p++;}
  if (*p == '-' && p[1]>='1' && p[1]<='9') {
    int n = p[1]-'0';
    x += n; y += n; w -= 2*n; h -= 2*n;
    p += 2;
  } else if (*p == '+' && p[1]>='1' && p[1]<='9') {
    int n = p[1]-'0';
    x -= n; y -= n; w += 2*n; h += 2*n;
    p += 2;
  }
  if (w < 10) {x -= (10-w)/2; w = 10;}
  if (h < 10) {y -= (10-h)/2; h = 10;}
  w = (w-1)|1; h = (h-1)|1;
  char flip_x = 0, flip_y = 0;
  if (*p=='$') {
    flip_x = 1;
    p++;
  }
  if (*p=='%') {
    flip_y = 1;
    p++;
  }
  int rotangle;
  switch (*p++) {
  case '0':
    rotangle = 1000*(p[1]-'0') + 100*(p[2]-'0') + 10*(p[3]-'0');
    p += 4;
    break;
  case '1': rotangle = 2250; break;
  case '2': rotangle = 2700; break;
  case '3': rotangle = 3150; break;
  case '4': rotangle = 1800; break;
  case '5':
  case '6': rotangle = 0; break;
  case '7': rotangle = 1350; break;
  case '8': rotangle =  900; break;
  case '9': rotangle =  450; break;
  default: rotangle = 0; p--; break;
  }
  int pos = find(p);
  if (!symbols[pos].notempty) return 0;
  if (symbols[pos].scalable == 3) { // kludge to detect return arrow
    fl_return_arrow(x,y,w,h);
    return 1;
  }
  fl_push_matrix();
  fl_translate(x+w/2,y+h/2);
  if (symbols[pos].scalable) {
    if (equalscale) {if (w<h) h = w; else w = h;}
    fl_scale(0.5*w, 0.5*h);
    fl_rotate(rotangle/10.0);
    if (flip_x) fl_scale(-1.0, 1.0);
    if (flip_y) fl_scale(1.0, -1.0);
  }
  (symbols[pos].drawit)(col);
  fl_pop_matrix();
  return 1;
}